

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

char * utrace_functionName_63(int32_t fnNumber)

{
  char *pcStack_10;
  int32_t fnNumber_local;
  
  if ((fnNumber < 0) || (1 < fnNumber)) {
    if ((fnNumber < 0x1000) || (0x1007 < fnNumber)) {
      if ((fnNumber < 0x2000) || (0x2008 < fnNumber)) {
        pcStack_10 = "[BOGUS Trace Function Number]";
      }
      else {
        pcStack_10 = trCollNames[fnNumber + -0x2000];
      }
    }
    else {
      pcStack_10 = trConvNames[fnNumber + -0x1000];
    }
  }
  else {
    pcStack_10 = trFnName[fnNumber];
  }
  return pcStack_10;
}

Assistant:

U_CAPI const char * U_EXPORT2
utrace_functionName(int32_t fnNumber) {
    if(UTRACE_FUNCTION_START <= fnNumber && fnNumber < UTRACE_FUNCTION_LIMIT) {
        return trFnName[fnNumber];
    } else if(UTRACE_CONVERSION_START <= fnNumber && fnNumber < UTRACE_CONVERSION_LIMIT) {
        return trConvNames[fnNumber - UTRACE_CONVERSION_START];
    } else if(UTRACE_COLLATION_START <= fnNumber && fnNumber < UTRACE_COLLATION_LIMIT){
        return trCollNames[fnNumber - UTRACE_COLLATION_START];
    } else {
        return "[BOGUS Trace Function Number]";
    }
}